

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  uint *pInfo_00;
  Aig_Obj_t *pAVar2;
  int *piVar3;
  int local_3c;
  int local_38;
  int Value;
  int Val1;
  int Val0;
  uint *pInfo;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  pInfo_00 = (uint *)Vec_PtrEntry(p->vTerInfo,iFrame);
  p_local._4_4_ = Saig_ManBmcSimInfoGet(pInfo_00,pObj);
  if (p_local._4_4_ == 0) {
    iVar1 = Aig_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                        ,0x4d3,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        pAVar2 = Aig_ObjFanin0(pObj);
        Value = Saig_ManBmcRunTerSim_rec(p,pAVar2,iFrame);
        pAVar2 = Aig_ObjFanin1(pObj);
        local_38 = Saig_ManBmcRunTerSim_rec(p,pAVar2,iFrame);
        iVar1 = Aig_ObjFaninC0(pObj);
        if (iVar1 != 0) {
          Value = Saig_ManBmcSimInfoNot(Value);
        }
        iVar1 = Aig_ObjFaninC1(pObj);
        if (iVar1 != 0) {
          local_38 = Saig_ManBmcSimInfoNot(local_38);
        }
        local_3c = Saig_ManBmcSimInfoAnd(Value,local_38);
      }
      else {
        if (iFrame < 1) {
          __assert_fail("iFrame > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                        ,0x4c6,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
        }
        pAVar2 = Saig_ObjLoToLi(p->pAig,pObj);
        local_3c = Saig_ManBmcRunTerSim_rec(p,pAVar2,iFrame + -1);
      }
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      local_3c = Saig_ManBmcRunTerSim_rec(p,pAVar2,iFrame);
      iVar1 = Aig_ObjFaninC0(pObj);
      if (iVar1 != 0) {
        local_3c = Saig_ManBmcSimInfoNot(local_3c);
      }
    }
    Saig_ManBmcSimInfoSet(pInfo_00,pObj,local_3c);
    piVar3 = Saig_ManBmcMapping(p,pObj);
    if ((piVar3 != (int *)0x0) && (local_3c != 3)) {
      Saig_ManBmcSetLiteral(p,pObj,iFrame,(uint)(local_3c == 2));
    }
    p_local._4_4_ = local_3c;
  }
  return p_local._4_4_;
}

Assistant:

int Saig_ManBmcRunTerSim_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pInfo = (unsigned *)Vec_PtrEntry( p->vTerInfo, iFrame );
    int Val0, Val1, Value = Saig_ManBmcSimInfoGet( pInfo, pObj );
    if ( Value != SAIG_TER_NON )
    {
/*
        // check the value of this literal in the SAT solver
        if ( Value == SAIG_TER_UND && Saig_ManBmcMapping(p, pObj) )
        {
            int Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
            if ( Lit >= 0  )
            {
                assert( Lit >= 2 );
                if ( p->pSat->assigns[Abc_Lit2Var(Lit)] < 2 )
                {
                    p->nUniProps++;
                    if ( Abc_LitIsCompl(Lit) ^ (p->pSat->assigns[Abc_Lit2Var(Lit)] == 0) )
                        Value = SAIG_TER_ONE;
                    else
                        Value = SAIG_TER_ZER;

//                    Value = SAIG_TER_UND;  // disable!

                    // use the new value
                    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
                    // transfer to the unrolling
                    if ( Value != SAIG_TER_UND )
                        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
                }
            }
        }
*/
        return Value;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Value = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            Value = Saig_ManBmcSimInfoNot( Value );
    }
    else if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( iFrame > 0 );
        Value = Saig_ManBmcRunTerSim_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame - 1 );
    }
    else if ( Aig_ObjIsNode(pObj) )
    {
        Val0 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame  );
        Val1 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin1(pObj), iFrame  );
        if ( Aig_ObjFaninC0(pObj) )
            Val0 = Saig_ManBmcSimInfoNot( Val0 );
        if ( Aig_ObjFaninC1(pObj) )
            Val1 = Saig_ManBmcSimInfoNot( Val1 );
        Value = Saig_ManBmcSimInfoAnd( Val0, Val1 );
    }
    else assert( 0 );
    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
    // transfer to the unrolling
    if ( Saig_ManBmcMapping(p, pObj) && Value != SAIG_TER_UND )
        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
    return Value;
}